

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  uint uVar2;
  ImGuiViewportFlags IVar3;
  int iVar4;
  ImGuiContextHook *pIVar5;
  ImGuiViewportP *pIVar6;
  ImGuiWindow *window;
  ImDrawData *pIVar7;
  ImGuiContext *pIVar8;
  ulong uVar9;
  ImDrawList *pIVar10;
  char *__function;
  float fVar11;
  ImGuiContext *g;
  float fVar12;
  int iVar13;
  ImDrawList **ppIVar14;
  int iVar15;
  ulong uVar16;
  int n;
  long lVar17;
  ImGuiWindow *pIVar18;
  long lVar19;
  ImGuiWindow *pIVar20;
  float scale;
  ImVec2 mouse_cursor_size;
  ImVec2 mouse_cursor_offset;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 mouse_cursor_uv [4];
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiWindow *local_58 [2];
  ImVec2 local_48;
  undefined8 uStack_40;
  ImVec2 local_38;
  undefined8 uStack_30;
  
  pIVar8 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x11e3,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar8->FrameCountRendered = pIVar8->FrameCount;
  (pIVar8->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar8->Hooks).Size) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      pIVar5 = (pIVar8->Hooks).Data;
      if (*(int *)(pIVar5 + lVar17) == 4) {
        (**(code **)(pIVar5 + lVar17 + 8))(pIVar8);
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar19 < (pIVar8->Hooks).Size);
  }
  uVar2 = (pIVar8->Viewports).Size;
  uVar9 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar16 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar16) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_00130f11;
      }
      pIVar6 = (pIVar8->Viewports).Data[uVar16];
      ImDrawDataBuilder::Clear(&pIVar6->DrawDataBuilder);
      if (pIVar6->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar6,0,"##Background");
        AddDrawListToDrawData((pIVar6->DrawDataBuilder).Layers,pIVar10);
      }
      uVar16 = uVar16 + 1;
      uVar9 = (ulong)(uint)(pIVar8->Viewports).Size;
    } while (uVar16 != uVar9);
  }
  pIVar20 = pIVar8->NavWindowingTarget;
  if ((pIVar20 == (ImGuiWindow *)0x0) || ((pIVar20->Flags & 0x2000) != 0)) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = pIVar20->RootWindow;
  }
  local_58[0] = pIVar18;
  if (pIVar20 == (ImGuiWindow *)0x0) {
    pIVar20 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar20 = pIVar8->NavWindowingListWindow;
  }
  local_58[1] = pIVar20;
  uVar2 = (pIVar8->Windows).Size;
  uVar9 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar16 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar16) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_00130f11:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,__function);
      }
      window = (pIVar8->Windows).Data[uVar16];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar20 && window != pIVar18) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        }
      }
      uVar16 = uVar16 + 1;
      uVar9 = (ulong)(uint)(pIVar8->Windows).Size;
    } while (uVar16 != uVar9);
  }
  lVar17 = 0;
  do {
    pIVar20 = local_58[lVar17];
    if (((pIVar20 != (ImGuiWindow *)0x0) && (pIVar20->Active == true)) && (pIVar20->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar20,(uint)pIVar20->Flags >> 0x19 & 1);
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  uStack_30 = 0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  if (((pIVar8->IO).MouseDrawCursor != false) && (pIVar8->MouseCursor != -1)) {
    ImFontAtlas::GetMouseCursorTexData
              ((pIVar8->IO).Fonts,pIVar8->MouseCursor,&local_60,&local_68,&local_48,&local_38);
  }
  (pIVar8->IO).MetricsRenderVertices = 0;
  (pIVar8->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar8->Viewports).Size) {
    lVar17 = 0;
    do {
      pIVar6 = (pIVar8->Viewports).Data[lVar17];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar6->DrawDataBuilder);
      if ((0.0 < local_68.x) && (0.0 < local_68.y)) {
        fVar12 = (pIVar6->super_ImGuiViewport).Pos.y;
        fVar11 = (pIVar8->IO).MousePos.y;
        if ((fVar11 < (pIVar6->super_ImGuiViewport).Size.y + fVar12) &&
           (scale = (pIVar8->Style).MouseCursorScale * (pIVar6->super_ImGuiViewport).DpiScale,
           fVar12 < (local_68.y + 2.0) * scale + fVar11)) {
          fVar12 = (pIVar6->super_ImGuiViewport).Pos.x;
          fVar11 = (pIVar8->IO).MousePos.x;
          if ((fVar11 < (pIVar6->super_ImGuiViewport).Size.x + fVar12) &&
             (fVar12 < (local_68.x + 2.0) * scale + fVar11)) {
            pIVar10 = GetViewportDrawList(pIVar6,1,"##Foreground");
            RenderMouseCursor(pIVar10,(pIVar8->IO).MousePos,scale,pIVar8->MouseCursor,0xffffffff,
                              0xff000000,0x30000000);
          }
        }
      }
      if (pIVar6->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar6,1,"##Foreground");
        AddDrawListToDrawData((pIVar6->DrawDataBuilder).Layers,pIVar10);
      }
      IVar3 = (pIVar6->super_ImGuiViewport).Flags;
      (pIVar6->super_ImGuiViewport).DrawData = &pIVar6->DrawDataP;
      (pIVar6->DrawDataP).Valid = true;
      iVar4 = (pIVar6->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar4 < 1) {
        ppIVar14 = (ImDrawList **)0x0;
      }
      else {
        ppIVar14 = (pIVar6->DrawDataBuilder).Layers[0].Data;
      }
      fVar11 = 0.0;
      (pIVar6->DrawDataP).CmdLists = ppIVar14;
      (pIVar6->DrawDataP).CmdListsCount = iVar4;
      (pIVar6->DrawDataP).TotalIdxCount = 0;
      (pIVar6->DrawDataP).TotalVtxCount = 0;
      (pIVar6->DrawDataP).DisplayPos = (pIVar6->super_ImGuiViewport).Pos;
      fVar12 = 0.0;
      if (-1 < (char)IVar3) {
        fVar12 = (pIVar6->super_ImGuiViewport).Size.x;
        fVar11 = (pIVar6->super_ImGuiViewport).Size.y;
      }
      (pIVar6->DrawDataP).DisplaySize.x = fVar12;
      (pIVar6->DrawDataP).DisplaySize.y = fVar11;
      if (GImGui == (ImGuiContext *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0xd45,"ImGuiIO &ImGui::GetIO()");
      }
      (pIVar6->DrawDataP).FramebufferScale = (GImGui->IO).DisplayFramebufferScale;
      (pIVar6->DrawDataP).OwnerViewport = &pIVar6->super_ImGuiViewport;
      if (0 < iVar4) {
        lVar19 = 0;
        iVar13 = 0;
        iVar15 = 0;
        do {
          pIVar10 = (pIVar6->DrawDataBuilder).Layers[0].Data[lVar19];
          iVar15 = iVar15 + (pIVar10->VtxBuffer).Size;
          iVar13 = iVar13 + (pIVar10->IdxBuffer).Size;
          lVar19 = lVar19 + 1;
        } while (iVar4 != lVar19);
        (pIVar6->DrawDataP).TotalVtxCount = iVar15;
        (pIVar6->DrawDataP).TotalIdxCount = iVar13;
      }
      pIVar7 = (pIVar6->super_ImGuiViewport).DrawData;
      piVar1 = &(pIVar8->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + pIVar7->TotalVtxCount;
      piVar1 = &(pIVar8->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + pIVar7->TotalIdxCount;
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pIVar8->Viewports).Size);
  }
  if (0 < (pIVar8->Hooks).Size) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      pIVar5 = (pIVar8->Hooks).Data;
      if (*(int *)(pIVar5 + lVar17) == 5) {
        (**(code **)(pIVar5 + lVar17 + 8))(pIVar8,pIVar5 + lVar17);
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar19 < (pIVar8->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        g.IO.MetricsRenderVertices += viewport->DrawData->TotalVtxCount;
        g.IO.MetricsRenderIndices += viewport->DrawData->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}